

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_urlglob.c
# Opt level: O0

_Bool peek_ipv6(char *str,size_t *skip)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  CURLUcode rc;
  size_t hlen;
  char *endbr;
  CURLU *u;
  char hostname [128];
  size_t *skip_local;
  char *str_local;
  
  pcVar2 = strchr(str,0x5d);
  if (pcVar2 == (char *)0x0) {
    str_local._7_1_ = false;
  }
  else {
    pcVar2 = pcVar2 + (1 - (long)str);
    if (pcVar2 < (char *)0x80) {
      lVar3 = curl_url();
      if (lVar3 == 0) {
        str_local._7_1_ = false;
      }
      else {
        memcpy(&u,str,(size_t)pcVar2);
        hostname[(long)(pcVar2 + -8)] = '\0';
        iVar1 = curl_url_set(lVar3,0,&u);
        curl_url_cleanup(lVar3);
        if (iVar1 == 0) {
          *skip = (size_t)pcVar2;
        }
        str_local._7_1_ = iVar1 == 0;
      }
    }
    else {
      str_local._7_1_ = false;
    }
  }
  return str_local._7_1_;
}

Assistant:

static bool peek_ipv6(const char *str, size_t *skip)
{
  /*
   * Scan for a potential IPv6 literal.
   * - Valid globs contain a hyphen and <= 1 colon.
   * - IPv6 literals contain no hyphens and >= 2 colons.
   */
  char hostname[MAX_IP6LEN];
  CURLU *u;
  char *endbr = strchr(str, ']');
  size_t hlen;
  CURLUcode rc;
  if(!endbr)
    return FALSE;

  hlen = endbr - str + 1;
  if(hlen >= MAX_IP6LEN)
    return FALSE;

  u = curl_url();
  if(!u)
    return FALSE;

  memcpy(hostname, str, hlen);
  hostname[hlen] = 0;

  /* ask to "guess scheme" as then it works without an https:// prefix */
  rc = curl_url_set(u, CURLUPART_URL, hostname, CURLU_GUESS_SCHEME);

  curl_url_cleanup(u);
  if(!rc)
    *skip = hlen;
  return rc ? FALSE : TRUE;
}